

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

undefined8 __thiscall TypedImageChannel<float>::slice(TypedImageChannel<float> *this)

{
  int iVar1;
  int iVar2;
  PixelType PVar3;
  Image *this_00;
  Box2i *pBVar4;
  Box *pBVar5;
  TypedImageChannel<float> *in_RSI;
  undefined8 in_RDI;
  int w;
  Box2i *dw;
  
  this_00 = ImageChannel::image(&in_RSI->super_ImageChannel);
  pBVar4 = Image::dataWindow(this_00);
  iVar1 = (pBVar4->max).x;
  iVar2 = (pBVar4->min).x;
  PVar3 = pixelType(in_RSI);
  pBVar5 = (Box *)Imf_3_4::Array2D<float>::operator[](&in_RSI->_pixels,0);
  Imf_3_4::Slice::Make
            ((PixelType)in_RDI,(void *)(ulong)PVar3,pBVar5,(ulong)pBVar4,4,
             ((iVar1 - iVar2) + 1) / in_RSI->_xSampling << 2,in_RSI->_xSampling,0.0,
             SUB41(in_RSI->_ySampling,0),false);
  return in_RDI;
}

Assistant:

IMF::Slice
TypedImageChannel<T>::slice () const
{
    const IMATH_NAMESPACE::Box2i& dw = image ().dataWindow ();
    int                           w  = dw.max.x - dw.min.x + 1;

    return IMF::Slice::Make (
        pixelType (),
        &_pixels[0][0],
        dw,
        sizeof (T),
        (w / _xSampling) * sizeof (T),
        _xSampling,
        _ySampling);
}